

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

int make_var_live(gen_ctx_t gen_ctx,MIR_reg_t var,int scan_var,int point,int insn_p)

{
  void **ppvVar1;
  lr_ctx *plVar2;
  VARR_live_range_t *pVVar3;
  void *pvVar4;
  gen_ctx_t bm;
  bitmap_t pVVar5;
  lr_bb_t_conflict *pplVar6;
  int iVar7;
  live_range_t_conflict plVar8;
  live_range_t_conflict plVar9;
  live_range_t plVar10;
  int extraout_EDX;
  uint extraout_EDX_00;
  uint start;
  uint uVar11;
  size_t nb;
  size_t nb_00;
  gen_ctx_t gen_ctx_00;
  gen_ctx_t pgVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  
  nb = (size_t)var;
  plVar2 = gen_ctx->lr_ctx;
  pVVar3 = plVar2->var_live_ranges;
  iVar13 = insn_p;
  if (((pVVar3 == (VARR_live_range_t *)0x0) || (pVVar3->varr == (live_range_t_conflict *)0x0)) ||
     (uVar15 = (ulong)var, pVVar3->els_num <= uVar15)) {
    make_var_live_cold_4();
LAB_0016fd23:
    make_var_live_cold_2();
    gen_ctx_00 = gen_ctx;
LAB_0016fd28:
    make_var_live_cold_3();
  }
  else {
    plVar8 = pVVar3->varr[uVar15];
    if ((insn_p == 0) || (plVar2->scan_vars_num != 0)) {
LAB_0016fc60:
      pgVar12 = (gen_ctx_t)gen_ctx->lr_ctx->live_vars;
      uVar14 = (ulong)scan_var;
      nb = uVar14 + 1;
      gen_ctx_00 = pgVar12;
      bitmap_expand((bitmap_t)pgVar12,nb);
      if (pgVar12 != (gen_ctx_t)0x0) {
        pvVar4 = (&pgVar12->curr_func_item->data)[uVar14 >> 6];
        iVar7 = 0;
        (&pgVar12->curr_func_item->data)[uVar14 >> 6] =
             (void *)((ulong)pvVar4 | 1L << (uVar14 & 0x3f));
        if ((((ulong)pvVar4 >> (uVar14 & 0x3f) & 1) != 0) ||
           (((insn_p != 0 && (plVar8 != (live_range_t_conflict)0x0)) &&
            ((plVar8->lr_bb == (lr_bb_t_conflict)0x0 &&
             (iVar7 = 1, plVar8->finish + 1 == point || plVar8->finish == point)))))) {
          return iVar7;
        }
        pVVar3 = gen_ctx->lr_ctx->var_live_ranges;
        nb = (size_t)(uint)point;
        plVar8 = create_live_range(gen_ctx,point,-1,plVar8);
        if (((pVVar3 != (VARR_live_range_t *)0x0) && (pVVar3->varr != (live_range_t_conflict *)0x0))
           && (uVar15 < pVVar3->els_num)) {
          pVVar3->varr[uVar15] = plVar8;
          return 1;
        }
        goto LAB_0016fd23;
      }
      goto LAB_0016fd28;
    }
    pgVar12 = (gen_ctx_t)plVar2->referenced_vars;
    nb = uVar15 + 1;
    gen_ctx_00 = pgVar12;
    bitmap_expand((bitmap_t)pgVar12,nb);
    if (pgVar12 != (gen_ctx_t)0x0) {
      ppvVar1 = &pgVar12->curr_func_item->data + (var >> 6);
      *ppvVar1 = (void *)((ulong)*ppvVar1 | 1L << (uVar15 & 0x3f));
      goto LAB_0016fc60;
    }
  }
  make_var_live_cold_1();
  iVar7 = (int)nb;
  if (gen_ctx_00->lr_ctx->scan_vars_num == 0) {
    return iVar7;
  }
  if (iVar7 < 0) {
LAB_0016fd6b:
    __assert_fail("scan_var >= 0 && (int) (VARR_MIR_reg_tlength (gen_ctx->lr_ctx->scan_var_to_var_map)) > scan_var"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x171b,"MIR_reg_t scan_var_to_var(gen_ctx_t, int)");
  }
  plVar10 = (live_range_t)gen_ctx_00->lr_ctx->scan_var_to_var_map;
  if (plVar10 == (live_range_t)0x0) {
    scan_var_to_var_cold_2();
  }
  else {
    pplVar6 = &plVar10->lr_bb;
    if ((int)*pplVar6 <= iVar7) goto LAB_0016fd6b;
    plVar10 = *(live_range_t *)&plVar10->ref_cost;
    if ((plVar10 != (live_range_t)0x0) && ((lr_bb_t_conflict)(nb & 0xffffffff) < *pplVar6)) {
      return *(int *)((long)&plVar10->lr_bb + (long)(nb & 0xffffffff) * 4);
    }
  }
  scan_var_to_var_cold_1();
  uVar11 = (uint)nb;
  start = (uint)plVar10;
  uVar15 = nb & 0xffffffff;
  pgVar12 = gen_ctx_00;
  if ((iVar13 != 0) && (gen_ctx_00->lr_ctx->scan_vars_num == 0)) {
    bm = (gen_ctx_t)gen_ctx_00->lr_ctx->referenced_vars;
    nb_00 = uVar15 + 1;
    pgVar12 = bm;
    bitmap_expand((bitmap_t)bm,nb_00);
    uVar11 = (uint)nb_00;
    if (bm == (gen_ctx_t)0x0) goto LAB_0016fe7f;
    plVar10 = (live_range_t)(uVar15 >> 6);
    ppvVar1 = &bm->curr_func_item->data + (long)plVar10;
    *ppvVar1 = (void *)((ulong)*ppvVar1 | 1L << (nb & 0x3f));
  }
  pVVar3 = gen_ctx_00->lr_ctx->var_live_ranges;
  if (((pVVar3 == (VARR_live_range_t *)0x0) ||
      (plVar10 = (live_range_t)pVVar3->varr, plVar10 == (live_range_t)0x0)) ||
     (pVVar3->els_num <= uVar15)) {
    make_var_dead_cold_4();
LAB_0016fe75:
    make_var_dead_cold_2();
  }
  else {
    pVVar5 = gen_ctx_00->lr_ctx->live_vars;
    if (pVVar5 != (bitmap_t)0x0) {
      plVar8 = (live_range_t_conflict)(&plVar10->lr_bb)[uVar15];
      plVar9 = (live_range_t_conflict)(long)extraout_EDX;
      if ((plVar9 < (live_range_t_conflict)(pVVar5->els_num << 6)) &&
         (uVar14 = pVVar5->varr[(ulong)plVar9 >> 6],
         pVVar5->varr[(ulong)plVar9 >> 6] = uVar14 & ~(1L << ((ulong)plVar9 & 0x3f)),
         (uVar14 >> ((ulong)plVar9 & 0x3f) & 1) != 0)) {
        plVar8->finish = start;
LAB_0016fe67:
        return (int)plVar9;
      }
      uVar11 = start;
      plVar9 = create_live_range(gen_ctx_00,start,start,plVar8);
      plVar10 = (live_range_t)pVVar3->varr;
      pgVar12 = gen_ctx_00;
      if ((plVar10 != (live_range_t)0x0) && (uVar15 < pVVar3->els_num)) {
        (&plVar10->lr_bb)[uVar15] = (lr_bb_t_conflict)plVar9;
        goto LAB_0016fe67;
      }
      goto LAB_0016fe75;
    }
  }
  make_var_dead_cold_3();
LAB_0016fe7f:
  make_var_dead_cold_1();
  plVar8 = pgVar12->lr_ctx->free_lr_list;
  if (plVar8 == (live_range_t_conflict)0x0) {
    plVar8 = (live_range_t_conflict)malloc(0x20);
    if (plVar8 == (live_range_t_conflict)0x0) {
      util_error(pgVar12,"no memory");
    }
  }
  else {
    pgVar12->lr_ctx->free_lr_list = plVar8->next;
  }
  if ((int)uVar11 < 0) {
    __assert_fail("start >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x186d,"live_range_t create_live_range(gen_ctx_t, int, int, live_range_t)");
  }
  if (extraout_EDX_00 < uVar11) {
    __assert_fail("finish < 0 || start <= finish",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x186e,"live_range_t create_live_range(gen_ctx_t, int, int, live_range_t)");
  }
  plVar8->start = uVar11;
  plVar8->finish = extraout_EDX_00;
  plVar8->ref_cost = 1;
  plVar8->next = plVar10;
  plVar8->lr_bb = (lr_bb_t_conflict)0x0;
  return (int)plVar8;
}

Assistant:

static inline int make_var_live (gen_ctx_t gen_ctx, MIR_reg_t var, int scan_var, int point,
                                 int insn_p) {
  live_range_t lr;
  lr = VARR_GET (live_range_t, var_live_ranges, var);
  if (insn_p && scan_vars_num == 0) bitmap_set_bit_p (referenced_vars, var);
  if (!bitmap_set_bit_p (live_vars, scan_var)) return FALSE;
  /* Always start new live range for starting living at bb end or if
     the last live range is covering a whole bb: */
  if (!insn_p || lr == NULL || lr->lr_bb != NULL
      || (lr->finish != point && lr->finish + 1 != point)) {
    VARR_SET (live_range_t, var_live_ranges, var, create_live_range (gen_ctx, point, -1, lr));
  }
  return TRUE;
}